

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_echo(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA **ppDVar1;
  int iVar2;
  int iVar3;
  DESCRIPTOR_DATA *pDVar4;
  char buffer [9216];
  char acStack_2438 [9224];
  
  if (*argument == '\0') {
    send_to_char("Global echo what?\n\r",ch);
    return;
  }
  pDVar4 = descriptor_list;
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    do {
      if (pDVar4->connected == 0) {
        colorconv(acStack_2438,argument,pDVar4->character);
        iVar2 = get_trust(pDVar4->character);
        iVar3 = get_trust(ch);
        if (iVar3 <= iVar2) {
          send_to_char(ch->name,pDVar4->character);
          send_to_char(" globals: ",pDVar4->character);
        }
        send_to_char(acStack_2438,pDVar4->character);
        send_to_char("\n\r",pDVar4->character);
      }
      ppDVar1 = &pDVar4->next;
      pDVar4 = *ppDVar1;
    } while (*ppDVar1 != (DESCRIPTOR_DATA *)0x0);
  }
  return;
}

Assistant:

void do_echo(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char buffer[MAX_STRING_LENGTH * 2];

	if (argument[0] == '\0')
	{
		send_to_char("Global echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch))
			{
				send_to_char(ch->name, d->character);
				send_to_char(" globals: ", d->character);
			}

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}